

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Sol * exampleB(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs,
              long STEPS)

{
  vector<ride,std::allocator<ride>> *this;
  pointer prVar1;
  pointer prVar2;
  iterator __position;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  vector<ride,_std::allocator<ride>_> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ride *__args;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  veh v;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  value_type local_b8;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> local_98;
  long local_78;
  ulong local_70;
  vector<ride,_std::allocator<ride>_> *local_68;
  long local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_60 = STEPS;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6,(bool *)&local_98,
             (allocator_type *)&local_b8);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&local_98);
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < vehs) {
    lVar15 = 0;
    do {
      local_b8.avail_time = 0;
      local_b8.loc.x = 0;
      local_b8.loc.y = 0;
      local_b8.id = lVar15;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&local_98,&local_b8);
      lVar15 = lVar15 + 1;
    } while (vehs != lVar15);
  }
  if ((rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar9 = 0;
    local_68 = rides;
    do {
      local_b8.id = (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                     super__Vector_impl_data._M_start)->id;
      local_b8.avail_time =
           (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->avail_time;
      local_b8.loc.x =
           ((local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).x;
      local_b8.loc.y =
           ((local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
                (&local_98);
      pvVar7 = local_68;
      if (local_60 <= local_b8.avail_time) break;
      prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_start;
      prVar2 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar8 = (long)prVar2 - (long)prVar1 >> 6;
      if (prVar2 != prVar1) {
        plVar11 = &(prVar1->start).y;
        local_70 = 0xffffffffffffffff;
        uVar12 = 0;
        local_78 = 0;
        lVar15 = 0x7fffffffffffffff;
        do {
          if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0)
             && (local_b8.avail_time <= plVar11[-3])) {
            lVar13 = local_b8.loc.x - ((pt *)(plVar11 + -1))->x;
            lVar14 = -lVar13;
            if (0 < lVar13) {
              lVar14 = lVar13;
            }
            lVar10 = local_b8.loc.y - *plVar11;
            lVar13 = -lVar10;
            if (0 < lVar10) {
              lVar13 = lVar10;
            }
            lVar13 = lVar13 + lVar14;
            lVar10 = plVar11[-2] + local_b8.avail_time + lVar13;
            lVar14 = plVar11[-2] + plVar11[-4];
            if (lVar14 < lVar10) {
              lVar14 = lVar10;
            }
            if (lVar14 <= plVar11[-3] && lVar13 < lVar15) {
              lVar15 = lVar13;
              local_78 = lVar14;
              local_70 = uVar12;
            }
          }
          uVar6 = local_70;
          uVar12 = uVar12 + 1;
          plVar11 = plVar11 + 8;
        } while (uVar8 + (uVar8 == 0) != uVar12);
        rides = pvVar7;
        if (-1 < (long)local_70) {
          __args = prVar1 + local_70;
          this = (vector<ride,std::allocator<ride>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_b8.id);
          __position._M_current = *(ride **)(this + 8);
          if (__position._M_current == *(ride **)(this + 0x10)) {
            std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                      (this,__position,__args);
          }
          else {
            lVar15 = __args->id;
            lVar14 = __args->s_time;
            lVar13 = __args->e_time;
            lVar10 = __args->len;
            lVar3 = (__args->start).x;
            lVar4 = (__args->start).y;
            lVar5 = (__args->end).y;
            ((__position._M_current)->end).x = (__args->end).x;
            ((__position._M_current)->end).y = lVar5;
            ((__position._M_current)->start).x = lVar3;
            ((__position._M_current)->start).y = lVar4;
            (__position._M_current)->e_time = lVar13;
            (__position._M_current)->len = lVar10;
            (__position._M_current)->id = lVar15;
            (__position._M_current)->s_time = lVar14;
            *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
          }
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
          local_b8.avail_time = local_78;
          if (__args->e_time < local_78) {
            __assert_fail("min_end <= chosen.e_time",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                          ,0x89,"Sol exampleB(const vector<ride> &, const long, const long)");
          }
          local_b8.loc.x = (__args->end).x;
          local_b8.loc.y = (__args->end).y;
          std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                    (&local_98,&local_b8);
          uVar8 = (long)(pvVar7->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar7->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 6;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar8);
  }
  if (local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Sol exampleB(const vector<ride>& rides, const long vehs, const long STEPS) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_closeness = LONG_MAX;
        long min_idx = -1;
        long min_end = 0;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long end_time = max(v.avail_time + closeness + r.len, r.s_time + r.len); // max(no-wait, wait)
            if (closeness < min_closeness && end_time <= r.e_time) {
                min_closeness = closeness;
                min_idx = i;
                min_end = end_time;
            }
        }

        if (min_idx < 0) {
            continue; // leave out this car, cannot use it again
        }
        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        v.avail_time = min_end;
        assert(min_end <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}